

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

QString * __thiscall
ProjectBuilderMakefileGenerator::fixForOutput(ProjectBuilderMakefileGenerator *this,QString *values)

{
  byte bVar1;
  qsizetype qVar2;
  undefined8 in_RDX;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int rep;
  QRegularExpressionMatch match;
  QRegularExpression reg_var;
  undefined4 in_stack_fffffffffffffe78;
  MatchOption in_stack_fffffffffffffe7c;
  QMakeProject *in_stack_fffffffffffffe80;
  QString *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  int local_124;
  undefined1 local_108 [120];
  undefined1 local_90 [76];
  undefined4 local_44;
  QRegularExpressionMatch local_40 [8];
  undefined8 local_38;
  uint local_2c;
  undefined1 local_28 [24];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QString::QString(in_stack_fffffffffffffe88,
                   (char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  QFlags<QRegularExpression::PatternOption>::QFlags
            ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe7c);
  QRegularExpression::QRegularExpression
            ((QRegularExpression *)&local_10,(QString *)local_28,(QFlags_conflict *)(ulong)local_2c)
  ;
  QString::~QString((QString *)0x13951d);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  QRegularExpressionMatch::QRegularExpressionMatch((QRegularExpressionMatch *)&local_38);
  local_124 = 0;
  while( true ) {
    QFlags<QRegularExpression::MatchOption>::QFlags
              ((QFlags<QRegularExpression::MatchOption> *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe7c);
    QRegularExpression::match(local_40,&local_10,in_RDX,(long)local_124,0,local_44);
    QRegularExpressionMatch::operator=
              ((QRegularExpressionMatch *)in_stack_fffffffffffffe80,
               (QRegularExpressionMatch *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    bVar1 = QRegularExpressionMatch::hasMatch();
    QRegularExpressionMatch::~QRegularExpressionMatch(local_40);
    if ((bVar1 & 1) == 0) break;
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffe80,
                   (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QMakeProject::values
              (in_stack_fffffffffffffe80,
               (ProKey *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QRegularExpressionMatch::captured((int)local_90);
    qVar2 = QListSpecialMethodsBase<ProString>::indexOf<QString>
                      ((QListSpecialMethodsBase<ProString> *)in_stack_fffffffffffffe80,
                       (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       0x139635);
    QString::~QString((QString *)0x139647);
    ProKey::~ProKey((ProKey *)0x139654);
    if (qVar2 == -1) {
      in_stack_fffffffffffffe80 = *(QMakeProject **)(in_RSI + 0xd8);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffe80,
                     (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      QMakeProject::values
                (in_stack_fffffffffffffe80,
                 (ProKey *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      QRegularExpressionMatch::captured((int)local_108);
      ProString::ProString
                ((ProString *)in_stack_fffffffffffffe80,
                 (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      QList<ProString>::append
                ((QList<ProString> *)in_stack_fffffffffffffe80,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      ProString::~ProString((ProString *)0x1396ed);
      QString::~QString((QString *)0x1396fa);
      ProKey::~ProKey((ProKey *)0x139707);
    }
    local_124 = QRegularExpressionMatch::capturedEnd((int)&local_38);
  }
  QString::QString((QString *)in_stack_fffffffffffffe80,
                   (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_38);
  QRegularExpression::~QRegularExpression((QRegularExpression *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString
ProjectBuilderMakefileGenerator::fixForOutput(const QString &values)
{
    //get the environment variables references
    QRegularExpression reg_var("\\$\\((.*)\\)");
    QRegularExpressionMatch match;
    for (int rep = 0; (match = reg_var.match(values, rep)).hasMatch();) {
        if (project->values("QMAKE_PBX_VARS").indexOf(match.captured(1)) == -1)
            project->values("QMAKE_PBX_VARS").append(match.captured(1));
        rep = match.capturedEnd();
    }

    return values;
}